

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::ConcatenateColumns::dim_forward
          (Dim *__return_storage_ptr__,ConcatenateColumns *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  pointer pDVar2;
  ostream *os;
  invalid_argument *this_00;
  uint b;
  initializer_list<unsigned_int> x;
  string local_1b0 [32];
  ostringstream s;
  
  pDVar2 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pDVar1 == pDVar2) {
    __assert_fail("xs.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes-common.cc"
                  ,0x1e5,
                  "virtual Dim cnn::ConcatenateColumns::dim_forward(const vector<Dim> &) const");
  }
  _s = 1;
  if (pDVar2->nd != 0) {
    _s = pDVar2->d[0];
  }
  b = 1;
  do {
    if (pDVar2 == pDVar1) {
      x._M_len = 2;
      x._M_array = (iterator)&s;
      Dim::Dim(__return_storage_ptr__,x,b);
      return __return_storage_ptr__;
    }
    if (pDVar2->nd == 0) {
      if (_s != 1) goto LAB_0023451f;
    }
    else if (pDVar2->d[0] != _s) {
LAB_0023451f:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      os = std::operator<<((ostream *)&s,"Bad input dimensions in ConcatenateColumns: ");
      operator<<(os,xs);
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::invalid_argument::invalid_argument(this_00,local_1b0);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    if (b <= pDVar2->bd) {
      b = pDVar2->bd;
    }
    pDVar2 = pDVar2 + 1;
  } while( true );
}

Assistant:

Dim ConcatenateColumns::dim_forward(const vector<Dim>& xs) const {
  assert(xs.size() > 0);
  unsigned rows = xs[0][0];
  unsigned new_cols = 0;
  unsigned bd = 1;
  for (auto& d : xs) {
    if (d[0] != rows) {
      ostringstream s; s << "Bad input dimensions in ConcatenateColumns: " << xs;
      throw std::invalid_argument(s.str());
    }
    new_cols += d[1];
    bd = max(bd, d.bd);
  }
  return Dim({rows, new_cols}, bd);
}